

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void bitrv2(size_t n,size_t *ip,float *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float yi;
  float yr;
  float xi;
  float xr;
  size_t m2;
  size_t m;
  size_t l;
  size_t k1;
  size_t k;
  size_t j1;
  size_t j;
  float *a_local;
  size_t *ip_local;
  size_t n_local;
  
  *ip = 0;
  m = n;
  for (m2 = 1; m2 << 3 < m; m2 = m2 << 1) {
    m = m >> 1;
    for (j1 = 0; j1 < m2; j1 = j1 + 1) {
      ip[m2 + j1] = ip[j1] + m;
    }
  }
  lVar4 = m2 * 2;
  if (m2 << 3 == m) {
    for (k1 = 0; k1 < m2; k1 = k1 + 1) {
      for (j1 = 0; j1 < k1; j1 = j1 + 1) {
        lVar5 = j1 * 2 + ip[k1];
        lVar6 = k1 * 2 + ip[j1];
        fVar1 = a[lVar5];
        fVar2 = a[lVar5 + 1];
        fVar3 = a[lVar6 + 1];
        a[lVar5] = a[lVar6];
        a[lVar5 + 1] = fVar3;
        a[lVar6] = fVar1;
        a[lVar6 + 1] = fVar2;
        lVar5 = lVar4 + lVar5;
        lVar6 = m2 * 4 + lVar6;
        fVar1 = a[lVar5];
        fVar2 = a[lVar5 + 1];
        fVar3 = a[lVar6 + 1];
        a[lVar5] = a[lVar6];
        a[lVar5 + 1] = fVar3;
        a[lVar6] = fVar1;
        a[lVar6 + 1] = fVar2;
        lVar5 = lVar4 + lVar5;
        lVar6 = lVar6 + m2 * -2;
        fVar1 = a[lVar5];
        fVar2 = a[lVar5 + 1];
        fVar3 = a[lVar6 + 1];
        a[lVar5] = a[lVar6];
        a[lVar5 + 1] = fVar3;
        a[lVar6] = fVar1;
        a[lVar6 + 1] = fVar2;
        lVar5 = lVar4 + lVar5;
        lVar6 = m2 * 4 + lVar6;
        fVar1 = a[lVar5];
        fVar2 = a[lVar5 + 1];
        fVar3 = a[lVar6 + 1];
        a[lVar5] = a[lVar6];
        a[lVar5 + 1] = fVar3;
        a[lVar6] = fVar1;
        a[lVar6 + 1] = fVar2;
      }
      lVar5 = k1 * 2 + lVar4 + ip[k1];
      lVar6 = lVar5 + lVar4;
      fVar1 = a[lVar5];
      fVar2 = a[lVar5 + 1];
      fVar3 = a[lVar6 + 1];
      a[lVar5] = a[lVar6];
      a[lVar5 + 1] = fVar3;
      a[lVar6] = fVar1;
      a[lVar6 + 1] = fVar2;
    }
  }
  else {
    for (k1 = 1; k1 < m2; k1 = k1 + 1) {
      for (j1 = 0; j1 < k1; j1 = j1 + 1) {
        lVar5 = j1 * 2 + ip[k1];
        lVar6 = k1 * 2 + ip[j1];
        fVar1 = a[lVar5];
        fVar2 = a[lVar5 + 1];
        fVar3 = a[lVar6 + 1];
        a[lVar5] = a[lVar6];
        a[lVar5 + 1] = fVar3;
        a[lVar6] = fVar1;
        a[lVar6 + 1] = fVar2;
        lVar5 = lVar4 + lVar5;
        lVar6 = lVar4 + lVar6;
        fVar1 = a[lVar5];
        fVar2 = a[lVar5 + 1];
        fVar3 = a[lVar6 + 1];
        a[lVar5] = a[lVar6];
        a[lVar5 + 1] = fVar3;
        a[lVar6] = fVar1;
        a[lVar6 + 1] = fVar2;
      }
    }
  }
  return;
}

Assistant:

static void bitrv2(size_t n, size_t *ip, float *a)
{
    size_t j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}